

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O1

void __thiscall
bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_,string *str_raw)

{
  int iVar1;
  byte *pbVar2;
  char cVar3;
  byte bVar4;
  pointer puVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  string str;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar10 = 0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->N = N_;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  if (0 < (int)str_raw->_M_string_length) {
    lVar9 = 0;
    iVar10 = 0;
    do {
      cVar3 = (str_raw->_M_dataplus)._M_p[lVar9];
      if ((int)cVar3 - 0x30U < 10) {
        std::__cxx11::string::push_back((char)&local_50);
        iVar10 = iVar10 + 1;
      }
      else if (cVar3 != '_') {
        __assert_fail("str_raw[i] == \'_\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                      ,0x99,
                      "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)"
                     );
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)str_raw->_M_string_length);
  }
  uVar6 = local_48;
  uVar11 = this->N;
  if ((int)uVar11 < iVar10) {
    __assert_fail("num_digits <= N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                  ,0x9c,
                  "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)");
  }
  uVar7 = uVar11 + 7;
  if (-1 < (int)uVar11) {
    uVar7 = uVar11;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bits,(long)(int)((((int)uVar7 >> 3) - (uint)((uVar11 & 7) == 0)) + 1));
  uVar11 = (uint)uVar6;
  if (0 < (int)uVar11) {
    lVar9 = (ulong)(uVar11 & 0x7fffffff) + 1;
    uVar8 = 0;
    do {
      puVar5 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = puVar5[uVar8 >> 3];
      puVar5[uVar8 >> 3] =
           '\x01' << ((byte)uVar8 & 7) & (-(local_50[lVar9 + -2] != '0') ^ bVar4) ^ bVar4;
      lVar9 = lVar9 + -1;
      uVar8 = uVar8 + 1;
    } while (1 < lVar9);
  }
  iVar10 = this->N;
  while ((int)uVar11 < iVar10) {
    iVar1 = iVar10 + -1;
    iVar10 = iVar10 + 6;
    if (-1 < iVar1) {
      iVar10 = iVar1;
    }
    pbVar2 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (iVar10 >> 3);
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar1 & 7));
    iVar10 = iVar1;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

dynamic_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      
      bits.resize(NUM_BYTES(N));
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N-1; i>=len; i--) {
        set(i,0);
      }
    }